

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cpp
# Opt level: O0

void trun::split(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *strings,char *strInput,int splitChar)

{
  undefined8 __pos;
  size_type sVar1;
  size_type sVar2;
  allocator<char> local_f1;
  string local_f0;
  undefined1 local_d0 [8];
  string str_1;
  string local_a8;
  undefined1 local_88 [8];
  string str;
  size_t iStart;
  size_t iPos;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string input;
  int splitChar_local;
  char *strInput_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *strings_local;
  
  input.field_2._12_4_ = splitChar;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40,strInput,&local_41);
  std::allocator<char>::~allocator(&local_41);
  iStart = 0;
  while (iStart != 0xffffffffffffffff) {
    str.field_2._8_8_ = iStart;
    sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40
                       ,(char)input.field_2._12_4_,iStart);
    __pos = str.field_2._8_8_;
    if (sVar1 == 0xffffffffffffffff) {
      sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              length((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,__pos
                 ,sVar1 - str.field_2._8_8_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,"\t\n\v\f\r ",&local_f1);
      trim((string *)local_d0,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::allocator<char>::~allocator(&local_f1);
      sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              length((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0);
      if (sVar1 != 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(strings,(value_type *)local_d0);
      }
      std::__cxx11::string::~string((string *)local_d0);
      iStart = 0xffffffffffffffff;
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 str.field_2._8_8_,sVar1 - str.field_2._8_8_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,"\t\n\v\f\r ",
                 (allocator<char> *)(str_1.field_2._M_local_buf + 0xf));
      trim((string *)local_88,&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::allocator<char>::~allocator((allocator<char> *)(str_1.field_2._M_local_buf + 0xf));
      sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              length((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
      if (sVar2 != 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(strings,(value_type *)local_88);
      }
      iStart = sVar1 + 1;
      std::__cxx11::string::~string((string *)local_88);
    }
  }
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void split(std::vector<std::string> &strings, const char *strInput, int splitChar) {
      std::string input(strInput);
      size_t iPos = 0;
      while(iPos != std::string::npos)
      {
          size_t iStart = iPos;
          iPos = input.find(splitChar,iPos);
          if (iPos != std::string::npos)
          {
              std::string str = input.substr(iStart, iPos-iStart);
              trim(str);
              if (str.length() > 0) {
                strings.push_back(str);
              }
              iPos++;
          } else
          {
              std::string str = input.substr(iStart, input.length()-iStart);
              trim(str);
              if (str.length() > 0) {
                strings.push_back(str);
              }
          }
      }
    }